

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimatedPerspectiveCamera(XMLLoader *this,Ref<embree::XML> *xml)

{
  string *parmID;
  undefined8 uVar1;
  undefined8 uVar2;
  Ref<embree::SceneGraph::Node> RVar3;
  long *plVar4;
  AnimatedPerspectiveCameraNode *this_00;
  __atomic_base<unsigned_long> in_RDX;
  long lVar5;
  size_type __n;
  Ref<embree::XML> *xml_00;
  size_type sVar6;
  long *plVar7;
  Vec2f time_range;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  cameras;
  allocator local_99;
  undefined1 local_98 [16];
  undefined1 local_88 [88];
  
  lVar5 = *(long *)(*(size_t *)in_RDX._M_i + 0x88) - *(long *)(*(size_t *)in_RDX._M_i + 0x80);
  if (lVar5 == 0) {
    (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    __n = lVar5 >> 3;
    local_98._8_8_ = in_RDX._M_i;
    local_88._56_8_ = this;
    std::
    vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
    ::vector((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
              *)(local_88 + 0x40),__n,(allocator_type *)local_88);
    for (sVar6 = 0; __n != sVar6; sVar6 = sVar6 + 1) {
      xml_00 = *(Ref<embree::XML> **)local_98._8_8_;
      XML::child((XML *)local_98,(size_t)xml_00);
      RVar3 = loadPerspectiveCamera((XMLLoader *)local_88,xml_00);
      uVar1 = local_88._0_8_;
      local_88._32_4_ = (int)CONCAT71((int7)((ulong)RVar3.ptr >> 8),1);
      if ((element_type *)local_88._0_8_ == (element_type *)0x0) {
        plVar7 = (long *)0x0;
      }
      else {
        plVar4 = (long *)__dynamic_cast(local_88._0_8_,&SceneGraph::Node::typeinfo,
                                        &SceneGraph::PerspectiveCameraNode::typeinfo,0);
        plVar7 = (long *)0x0;
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 0x10))(plVar4);
          local_88._32_8_ = local_88._32_8_ & 0xffffffff00000000;
          plVar7 = plVar4;
        }
      }
      uVar2 = local_88._64_8_;
      plVar4 = *(long **)(local_88._64_8_ + sVar6 * 8);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x18))();
      }
      *(long **)(uVar2 + sVar6 * 8) = plVar7;
      if ((element_type *)uVar1 != (element_type *)0x0) {
        (**(code **)(*(long *)uVar1 + 0x18))(uVar1);
      }
      if ((BBox1f)local_98._0_8_ != (BBox1f)0x0) {
        (**(code **)(*(long *)local_98._0_8_ + 0x18))();
      }
    }
    parmID = *(string **)local_98._8_8_;
    std::__cxx11::string::string((string *)local_88,"time_range",&local_99);
    XML::parm_Vec2f((XML *)local_98,parmID);
    this = (XMLLoader *)local_88._56_8_;
    std::__cxx11::string::~string((string *)local_88);
    this_00 = (AnimatedPerspectiveCameraNode *)SceneGraph::PerspectiveCameraNode::operator_new(0xd0)
    ;
    local_88._32_8_ = local_98._0_8_;
    local_88._40_8_ = (pointer)0x0;
    std::__cxx11::string::string((string *)local_88,"",&local_99);
    SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
              (this_00,(vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                        *)(local_88 + 0x40),(BBox1f)local_88._32_8_,(string *)local_88);
    *(AnimatedPerspectiveCameraNode **)this = this_00;
    (*(this_00->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
    std::__cxx11::string::~string((string *)local_88);
    std::
    vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
    ::~vector((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               *)(local_88 + 0x40));
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimatedPerspectiveCamera(const Ref<XML>& xml) 
  {
    size_t numCameras = xml->size();
    if (numCameras == 0)
      return nullptr;
    
    std::vector<Ref<SceneGraph::PerspectiveCameraNode>> cameras(numCameras);
    
    for (size_t i=0; i<numCameras; i++) 
      cameras[i] = loadPerspectiveCamera(xml->child(i)).dynamicCast<SceneGraph::PerspectiveCameraNode>();

    const Vec2f time_range = xml->parm_Vec2f("time_range");
    return new SceneGraph::AnimatedPerspectiveCameraNode(std::move(cameras),BBox1f(time_range.x,time_range.y));
  }